

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void ClientObituary(AActor *self,AActor *inflictor,AActor *attacker,int dmgflags)

{
  player_t *ppVar1;
  PClass *pPVar2;
  AWeapon *pAVar3;
  FName FVar4;
  undefined8 *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  undefined8 *puVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar11;
  AActor *pAVar12;
  int gender;
  char *name;
  char gendermessage [1024];
  char local_438 [1032];
  
  ppVar1 = self->player;
  if (ppVar1 == (player_t *)0x0) {
    return;
  }
  if (ppVar1->mo != (APlayerPawn *)self) {
    return;
  }
  if (!show_obituaries.Value) {
    return;
  }
  puVar5 = (undefined8 *)
           ((long)&((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x209) * 0x18));
  do {
    puVar10 = puVar5;
    puVar5 = (undefined8 *)*puVar10;
  } while (*(int *)(puVar10 + 1) != 0x209);
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    MeansOfDeath.Index = 0;
  }
  FVar4.Index = MeansOfDeath.Index;
  gender = *(int *)(puVar10[2] + 0x28);
  if ((attacker == (AActor *)0x0) || (attacker->player != (player_t *)0x0)) {
    if (MeansOfDeath.Index == 0xc1) {
      bVar6 = AnnounceTelefrag(attacker,self);
    }
    else {
      bVar6 = AnnounceKill(attacker,self);
    }
    if (bVar6 != false) {
      return;
    }
  }
  name = (char *)0x0;
  switch(FVar4.Index) {
  case 0xbf:
    name = "OB_WATER";
    break;
  case 0xc0:
    name = "OB_SLIME";
    break;
  case 0xc1:
    break;
  case 0xc2:
    name = "OB_FALLING";
    break;
  case 0xc3:
    name = "OB_SUICIDE";
    break;
  case 0xc4:
    name = "OB_EXIT";
    break;
  default:
    if (FVar4.Index == 0x90) {
      name = "OB_CRUSH";
    }
    else if ((FVar4.Index == 0xa4) && (name = (char *)0x0, attacker == (AActor *)0x0)) {
      name = "OB_LAVA";
    }
  }
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    name = "OB_VOODOO";
  }
  if (name == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = FStringTable::operator()(&GStrings,name);
  }
  if ((attacker != (AActor *)0x0) && (pcVar9 == (char *)0x0)) {
    if (attacker == self) {
      pcVar9 = "OB_KILLEDSELF";
LAB_003fb85e:
      pcVar9 = FStringTable::operator()(&GStrings,pcVar9);
    }
    else {
      if (attacker->player == (player_t *)0x0) {
        if (FVar4.Index == 0x89) {
          if ((attacker->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
            (attacker->super_DThinker).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_02,iVar8);
          }
          pPVar2 = (attacker->super_DThinker).super_DObject.Class;
          if (*(int *)(*(long *)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.MemberOnly + -0xc) != 0) {
            if (pPVar2 == (PClass *)0x0) {
              iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
              (attacker->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_03,iVar8);
            }
            pcVar9 = *(char **)&(attacker->super_DThinker).super_DObject.Class[1].
                                super_PNativeStruct.super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.MemberOnly;
            goto LAB_003fb863;
          }
        }
        else if (FVar4.Index == 0xc1) {
          pcVar9 = "OB_MONTELEFRAG";
          goto LAB_003fb85e;
        }
        if ((attacker->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
          (attacker->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_04,iVar8)
          ;
        }
        pPVar2 = (attacker->super_DThinker).super_DObject.Class;
        if (*(int *)(*(long *)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                               super_PCompoundType.super_PType.Symbols.Symbols.Size + -0xc) != 0) {
          if (pPVar2 == (PClass *)0x0) {
            iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
            (attacker->super_DThinker).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_05,iVar8);
          }
          pcVar9 = *(char **)&(attacker->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                              super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols
                              .Symbols.Size;
          goto LAB_003fb863;
        }
      }
      pcVar9 = (char *)0x0;
    }
  }
LAB_003fb863:
  pAVar12 = self;
  if (((attacker == (AActor *)0x0) || (pcVar9 != (char *)0x0)) ||
     (attacker->player == (player_t *)0x0)) goto LAB_003fb91f;
  pAVar12 = attacker;
  if ((self->player != attacker->player) && (bVar6 = AActor::IsTeammate(self,attacker), bVar6)) {
    puVar5 = (undefined8 *)
             ((long)&((attacker->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((attacker->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x209) * 0x18));
    do {
      puVar10 = puVar5;
      puVar5 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x209);
    gender = *(int *)(puVar10[2] + 0x28);
    uVar7 = FRandom::GenRand32(&pr_obituary);
    mysnprintf(local_438,0x400,"OB_FRIENDLY%c",(ulong)((uVar7 & 3) + 0x31));
    pcVar9 = FStringTable::operator()(&GStrings,local_438);
    self = attacker;
    goto LAB_003fb91f;
  }
  if (FVar4.Index == 0xc1) {
    pcVar9 = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG");
  }
  else {
    pcVar9 = (char *)0x0;
  }
  if (pcVar9 != (char *)0x0) goto LAB_003fb91f;
  if (inflictor == (AActor *)0x0) {
LAB_003fbaac:
    pcVar9 = (char *)0x0;
  }
  else {
    if ((inflictor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(inflictor->super_DThinker).super_DObject._vptr_DObject)(inflictor);
      (inflictor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
    }
    pPVar2 = (inflictor->super_DThinker).super_DObject.Class;
    if (*(int *)(*(long *)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.Symbols.Symbols.Size + -0xc) == 0)
    goto LAB_003fbaac;
    if (pPVar2 == (PClass *)0x0) {
      iVar8 = (**(inflictor->super_DThinker).super_DObject._vptr_DObject)(inflictor);
      (inflictor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar8);
    }
    pcVar9 = *(char **)&(inflictor->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                        super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
                        Symbols.Size;
  }
  if (pcVar9 == (char *)0x0) {
    if (((dmgflags & 0x20U) == 0) ||
       (pAVar3 = attacker->player->ReadyWeapon, pAVar3 == (AWeapon *)0x0)) {
      pcVar9 = (char *)0x0;
    }
    else {
      if ((pAVar3->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
          Class == (PClass *)0x0) {
        iVar8 = (**(pAVar3->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(pAVar3);
        (pAVar3->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = (PClass *)CONCAT44(extraout_var_01,iVar8);
      }
      pcVar9 = *(char **)&(pAVar3->super_AStateProvider).super_AInventory.super_AActor.
                          super_DThinker.super_DObject.Class[1].super_PNativeStruct.super_PStruct.
                          super_PNamedType.super_PCompoundType.super_PType.Symbols.Symbols.Size;
    }
  }
  if (pcVar9 == (char *)0x0) {
    if (FVar4.Index == 0xc5) {
      name = "OB_RAILGUN";
    }
    else if (FVar4.Index == 200) {
      name = "OB_MPBFG_SPLASH";
    }
    if (name == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = FStringTable::operator()(&GStrings,name);
    }
  }
  if (pcVar9 == (char *)0x0) {
    if ((attacker->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
      (attacker->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_06,iVar8);
    }
    pcVar9 = *(char **)&(attacker->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                        super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
                        Symbols.Size;
  }
LAB_003fb91f:
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else if (*pcVar9 == '$') {
    pcVar9 = FStringTable::operator[](&GStrings,pcVar9 + 1);
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = FStringTable::operator()(&GStrings,"OB_DEFAULT");
  }
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    puVar5 = (undefined8 *)
             ((long)&((self->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((self->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar10 = puVar5;
      puVar5 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x1ea);
    puVar5 = (undefined8 *)
             ((long)&((pAVar12->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((pAVar12->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar11 = puVar5;
      puVar5 = (undefined8 *)*puVar11;
    } while (*(int *)(puVar11 + 1) != 0x1ea);
    SexMessage(pcVar9,local_438,gender,*(char **)(puVar10[2] + 0x28),*(char **)(puVar11[2] + 0x28));
    Printf(1,"%s\n",local_438);
  }
  return;
}

Assistant:

void ClientObituary (AActor *self, AActor *inflictor, AActor *attacker, int dmgflags)
{
	FName mod;
	const char *message;
	const char *messagename;
	char gendermessage[1024];
	int  gender;

	// No obituaries for non-players, voodoo dolls or when not wanted
	if (self->player == NULL || self->player->mo != self || !show_obituaries)
		return;

	gender = self->player->userinfo.GetGender();

	// Treat voodoo dolls as unknown deaths
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
		MeansOfDeath = NAME_None;

	mod = MeansOfDeath;
	message = NULL;
	messagename = NULL;

	if (attacker == NULL || attacker->player != NULL)
	{
		if (mod == NAME_Telefrag)
		{
			if (AnnounceTelefrag (attacker, self))
				return;
		}
		else
		{
			if (AnnounceKill (attacker, self))
				return;
		}
	}

	switch (mod)
	{
	case NAME_Suicide:		messagename = "OB_SUICIDE";		break;
	case NAME_Falling:		messagename = "OB_FALLING";		break;
	case NAME_Crush:		messagename = "OB_CRUSH";		break;
	case NAME_Exit:			messagename = "OB_EXIT";		break;
	case NAME_Drowning:		messagename = "OB_WATER";		break;
	case NAME_Slime:		messagename = "OB_SLIME";		break;
	case NAME_Fire:			if (attacker == NULL) messagename = "OB_LAVA";		break;
	}

	// Check for being killed by a voodoo doll.
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
	{
		messagename = "OB_VOODOO";
	}

	if (messagename != NULL)
		message = GStrings(messagename);

	if (attacker != NULL && message == NULL)
	{
		if (attacker == self)
		{
			message = GStrings("OB_KILLEDSELF");
		}
		else if (attacker->player == NULL)
		{
			if (mod == NAME_Telefrag)
			{
				message = GStrings("OB_MONTELEFRAG");
			}
			else if (mod == NAME_Melee && attacker->GetClass()->HitObituary.IsNotEmpty())
			{
				message = attacker->GetClass()->HitObituary;
			}
			else if (attacker->GetClass()->Obituary.IsNotEmpty())
			{
				message = attacker->GetClass()->Obituary;
			}
		}
	}

	if (message == NULL && attacker != NULL && attacker->player != NULL)
	{
		if (self->player != attacker->player && self->IsTeammate(attacker))
		{
			self = attacker;
			gender = self->player->userinfo.GetGender();
			mysnprintf (gendermessage, countof(gendermessage), "OB_FRIENDLY%c", '1' + (pr_obituary() & 3));
			message = GStrings(gendermessage);
		}
		else
		{
			if (mod == NAME_Telefrag) message = GStrings("OB_MPTELEFRAG");
			if (message == NULL)
			{
				if (inflictor != NULL && inflictor->GetClass()->Obituary.IsNotEmpty())
				{
					message = inflictor->GetClass()->Obituary;
				}
				if (message == NULL && (dmgflags & DMG_PLAYERATTACK) && attacker->player->ReadyWeapon != NULL)
				{
					message = attacker->player->ReadyWeapon->GetClass()->Obituary;
				}
				if (message == NULL)
				{
					switch (mod)
					{
					case NAME_BFGSplash:	messagename = "OB_MPBFG_SPLASH";	break;
					case NAME_Railgun:		messagename = "OB_RAILGUN";			break;
					}
					if (messagename != NULL)
						message = GStrings(messagename);
				}
				if (message == NULL)
				{
					message = attacker->GetClass()->Obituary;
				}
			}
		}
	}
	else attacker = self;	// for the message creation

	if (message != NULL && message[0] == '$') 
	{
		message = GStrings[message+1];
	}

	if (message == NULL)
	{
		message = GStrings("OB_DEFAULT");
	}

	// [CK] Don't display empty strings
	if (message == NULL || strlen(message) <= 0)
		return;
		
	SexMessage (message, gendermessage, gender,
		self->player->userinfo.GetName(), attacker->player->userinfo.GetName());
	Printf (PRINT_MEDIUM, "%s\n", gendermessage);
}